

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseProtoKey(Parser *this)

{
  CheckedError *ce;
  long in_RSI;
  
  if (*(int *)(in_RSI + 0x1c) == 0x28) {
    do {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011b441;
    } while ((*(int *)(in_RSI + 0x1c) == 0x104) || (*(int *)(in_RSI + 0x1c) == 0x2e));
    do {
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
      if (*(int *)(in_RSI + 0x1c) != 0x2e) goto LAB_0011b43c;
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
  }
  else {
    Expect(this,(int)in_RSI);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
LAB_0011b43c:
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
LAB_0011b441:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoKey() {
  if (token_ == '(') {
    NEXT();
    // Skip "(a.b)" style custom attributes.
    while (token_ == '.' || token_ == kTokenIdentifier) NEXT();
    EXPECT(')');
    while (Is('.')) {
      NEXT();
      EXPECT(kTokenIdentifier);
    }
  } else {
    EXPECT(kTokenIdentifier);
  }
  return NoError();
}